

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall Lexer::readLineTerminator(Lexer *this)

{
  Token *token;
  Token *in_RDI;
  
  in_RDI->type = LineTerminatorToken;
  in_RDI->lineNumber = 0;
  in_RDI->columnNumber = 0;
  (in_RDI->tokenData)._M_dataplus._M_p = (pointer)&(in_RDI->tokenData).field_2;
  (in_RDI->tokenData)._M_string_length = 0;
  (in_RDI->tokenData).field_2._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

Token Lexer::readLineTerminator() {
    Token token{Token::LineTerminatorToken};
    return token;
}